

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O1

void __thiscall World::create_gold(World *this,pair<int,_int> gold)

{
  pointer pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)gold.first;
  pvVar1 = (this->boxes).
           super__Vector_base<std::vector<Room,_std::allocator<Room>_>,_std::allocator<std::vector<Room,_std::allocator<Room>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->boxes).
                 super__Vector_base<std::vector<Room,_std::allocator<Room>_>,_std::allocator<std::vector<Room,_std::allocator<Room>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  if (uVar3 <= uVar4 && uVar4 - uVar3 != 0) {
    lVar2 = *(long *)&pvVar1[uVar3].super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                      super__Vector_impl_data;
    if ((ulong)((long)gold >> 0x20) <
        (ulong)((long)*(pointer *)
                       ((long)&pvVar1[uVar3].super__Vector_base<Room,_std::allocator<Room>_>._M_impl
                               .super__Vector_impl_data + 8) - lVar2 >> 4)) {
      Room::set_glitter((Room *)(lVar2 + ((long)gold >> 0x20) * 0x10),true);
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  return;
}

Assistant:

void World::create_gold(pair<int, int> gold)
{
    int pos[] = {gold.first, gold.second};
    int point = convert_to_1d(pos);
    //initialize glitter
    boxes.at(pos[0]).at(pos[1]).set_glitter(true);
    //cout << pos[0] << ", " << pos[1] << " glitter" << endl;
}